

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_hash.cpp
# Opt level: O1

void fillAes4Rx4<true>(void *state,size_t outputSize,void *buffer)

{
  longlong in_RCX;
  uint8_t *outptr;
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  rx_vec_i128 key;
  rx_vec_i128 key_00;
  rx_vec_i128 key_01;
  rx_vec_i128 key_02;
  rx_vec_i128 key_03;
  rx_vec_i128 key_04;
  rx_vec_i128 key_05;
  rx_vec_i128 key_06;
  rx_vec_i128 key_07;
  rx_vec_i128 key_08;
  rx_vec_i128 key_09;
  rx_vec_i128 key_10;
  rx_vec_i128 key_11;
  rx_vec_i128 key_12;
  rx_vec_i128 key_13;
  rx_vec_i128 in;
  rx_vec_i128 in_00;
  rx_vec_i128 in_01;
  rx_vec_i128 in_02;
  rx_vec_i128 in_03;
  rx_vec_i128 in_04;
  rx_vec_i128 in_05;
  rx_vec_i128 in_06;
  rx_vec_i128 in_07;
  rx_vec_i128 in_08;
  rx_vec_i128 in_09;
  rx_vec_i128 in_10;
  rx_vec_i128 in_11;
  rx_vec_i128 in_12;
  rx_vec_i128 in_13;
  rx_vec_i128 in_14;
  rx_vec_i128 alVar3;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  
  if (0 < (long)outputSize) {
    puVar2 = (undefined8 *)(outputSize + (long)buffer);
    puVar1 = (undefined8 *)buffer;
    do {
      alVar3[1] = in_RCX;
      alVar3[0] = (longlong)buffer;
      in[1] = outputSize;
      in[0] = (longlong)state;
      alVar3 = soft_aesdec(in,alVar3);
      key[0] = alVar3[1];
      key[1] = in_RCX;
      in_00[1] = outputSize;
      in_00[0] = (longlong)state;
      alVar3 = soft_aesenc(in_00,key);
      key_00[0] = alVar3[1];
      key_00[1] = in_RCX;
      in_01[1] = outputSize;
      in_01[0] = (longlong)state;
      alVar3 = soft_aesdec(in_01,key_00);
      key_01[0] = alVar3[1];
      key_01[1] = in_RCX;
      in_02[1] = outputSize;
      in_02[0] = (longlong)state;
      alVar3 = soft_aesenc(in_02,key_01);
      key_02[0] = alVar3[1];
      key_02[1] = in_RCX;
      in_03[1] = outputSize;
      in_03[0] = (longlong)state;
      alVar3 = soft_aesdec(in_03,key_02);
      key_03[0] = alVar3[1];
      key_03[1] = in_RCX;
      in_04[1] = outputSize;
      in_04[0] = (longlong)state;
      alVar3 = soft_aesenc(in_04,key_03);
      key_04[0] = alVar3[1];
      key_04[1] = in_RCX;
      in_05[1] = outputSize;
      in_05[0] = (longlong)state;
      alVar3 = soft_aesdec(in_05,key_04);
      key_05[0] = alVar3[1];
      key_05[1] = in_RCX;
      in_06[1] = outputSize;
      in_06[0] = (longlong)state;
      alVar3 = soft_aesenc(in_06,key_05);
      key_06[0] = alVar3[1];
      key_06[1] = in_RCX;
      in_07[1] = outputSize;
      in_07[0] = (longlong)state;
      alVar3 = soft_aesdec(in_07,key_06);
      key_07[0] = alVar3[1];
      key_07[1] = in_RCX;
      in_08[1] = outputSize;
      in_08[0] = (longlong)state;
      alVar3 = soft_aesenc(in_08,key_07);
      key_08[0] = alVar3[1];
      key_08[1] = in_RCX;
      in_09[1] = outputSize;
      in_09[0] = (longlong)state;
      alVar3 = soft_aesdec(in_09,key_08);
      key_09[0] = alVar3[1];
      key_09[1] = in_RCX;
      in_10[1] = outputSize;
      in_10[0] = (longlong)state;
      alVar3 = soft_aesenc(in_10,key_09);
      key_10[0] = alVar3[1];
      key_10[1] = in_RCX;
      in_11[1] = outputSize;
      in_11[0] = (longlong)state;
      alVar3 = soft_aesdec(in_11,key_10);
      key_11[0] = alVar3[1];
      key_11[1] = in_RCX;
      in_12[1] = outputSize;
      in_12[0] = (longlong)state;
      alVar3 = soft_aesenc(in_12,key_11);
      key_12[0] = alVar3[1];
      local_58 = CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
      uStack_50 = CONCAT44(extraout_XMM0_Dd_00,extraout_XMM0_Dc_00);
      key_12[1] = in_RCX;
      in_13[1] = outputSize;
      in_13[0] = (longlong)state;
      alVar3 = soft_aesdec(in_13,key_12);
      key_13[0] = alVar3[1];
      local_68 = CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
      uStack_60 = CONCAT44(extraout_XMM0_Dd_01,extraout_XMM0_Dc_01);
      key_13[1] = in_RCX;
      in_14[1] = outputSize;
      in_14[0] = (longlong)state;
      alVar3 = soft_aesenc(in_14,key_13);
      buffer = alVar3[1];
      *puVar1 = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      puVar1[1] = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
      puVar1[2] = local_58;
      puVar1[3] = uStack_50;
      puVar1[4] = local_68;
      puVar1[5] = uStack_60;
      *(undefined4 *)(puVar1 + 6) = extraout_XMM0_Da_02;
      *(undefined4 *)((long)puVar1 + 0x34) = extraout_XMM0_Db_02;
      *(undefined4 *)(puVar1 + 7) = extraout_XMM0_Dc_02;
      *(undefined4 *)((long)puVar1 + 0x3c) = extraout_XMM0_Dd_02;
      puVar1 = puVar1 + 8;
    } while (puVar1 < puVar2);
  }
  return;
}

Assistant:

void fillAes4Rx4(void *state, size_t outputSize, void *buffer) {
	assert(outputSize % 64 == 0);
	const uint8_t* outptr = (uint8_t*)buffer;
	const uint8_t* outputEnd = outptr + outputSize;

	rx_vec_i128 state0, state1, state2, state3;
	rx_vec_i128 key0, key1, key2, key3, key4, key5, key6, key7;

	key0 = rx_set_int_vec_i128(AES_GEN_4R_KEY0);
	key1 = rx_set_int_vec_i128(AES_GEN_4R_KEY1);
	key2 = rx_set_int_vec_i128(AES_GEN_4R_KEY2);
	key3 = rx_set_int_vec_i128(AES_GEN_4R_KEY3);
	key4 = rx_set_int_vec_i128(AES_GEN_4R_KEY4);
	key5 = rx_set_int_vec_i128(AES_GEN_4R_KEY5);
	key6 = rx_set_int_vec_i128(AES_GEN_4R_KEY6);
	key7 = rx_set_int_vec_i128(AES_GEN_4R_KEY7);

	state0 = rx_load_vec_i128((rx_vec_i128*)state + 0);
	state1 = rx_load_vec_i128((rx_vec_i128*)state + 1);
	state2 = rx_load_vec_i128((rx_vec_i128*)state + 2);
	state3 = rx_load_vec_i128((rx_vec_i128*)state + 3);

	while (outptr < outputEnd) {
		state0 = aesdec<softAes>(state0, key0);
		state1 = aesenc<softAes>(state1, key0);
		state2 = aesdec<softAes>(state2, key4);
		state3 = aesenc<softAes>(state3, key4);

		state0 = aesdec<softAes>(state0, key1);
		state1 = aesenc<softAes>(state1, key1);
		state2 = aesdec<softAes>(state2, key5);
		state3 = aesenc<softAes>(state3, key5);

		state0 = aesdec<softAes>(state0, key2);
		state1 = aesenc<softAes>(state1, key2);
		state2 = aesdec<softAes>(state2, key6);
		state3 = aesenc<softAes>(state3, key6);

		state0 = aesdec<softAes>(state0, key3);
		state1 = aesenc<softAes>(state1, key3);
		state2 = aesdec<softAes>(state2, key7);
		state3 = aesenc<softAes>(state3, key7);

		rx_store_vec_i128((rx_vec_i128*)outptr + 0, state0);
		rx_store_vec_i128((rx_vec_i128*)outptr + 1, state1);
		rx_store_vec_i128((rx_vec_i128*)outptr + 2, state2);
		rx_store_vec_i128((rx_vec_i128*)outptr + 3, state3);

		outptr += 64;
	}
}